

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O1

int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *p,int iLit0,int iLit1)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Kit_DsdObj_t *pKVar6;
  ulong uVar7;
  Kit_DsdObj_t *pKVar8;
  
  if (-1 < iLit0) {
    if ((iLit0 & 1U) != 0) {
      __assert_fail("!Abc_LitIsCompl(iLit0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                    ,0x108,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
    }
    if (-1 < iLit1) {
      if ((iLit1 & 1U) != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                      ,0x109,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
      }
      uVar5 = (uint)iLit0 >> 1;
      uVar1 = p->nVars;
      uVar4 = (uint)p->nNodes + (uint)uVar1;
      if (uVar5 < uVar4) {
        if (uVar5 < uVar1) {
          pKVar8 = (Kit_DsdObj_t *)0x0;
        }
        else {
          pKVar8 = p->pNodes[(ulong)uVar5 - (ulong)uVar1];
        }
        uVar5 = (uint)iLit1 >> 1;
        if (uVar5 < uVar4) {
          if (uVar5 < uVar1) {
            pKVar6 = (Kit_DsdObj_t *)0x0;
          }
          else {
            pKVar6 = p->pNodes[(ulong)uVar5 - (ulong)uVar1];
          }
          if (pKVar8 != (Kit_DsdObj_t *)0x0 || pKVar6 != (Kit_DsdObj_t *)0x0) {
            if (pKVar8 == (Kit_DsdObj_t *)0x0) {
              return 0;
            }
            if (pKVar6 == (Kit_DsdObj_t *)0x0) {
              return 0;
            }
            if (0x3ffffff < ((uint)*pKVar6 ^ (uint)*pKVar8)) {
              return 0;
            }
            uVar4 = (uint)*pKVar8 >> 6 & 7;
            if (uVar4 != ((uint)*pKVar6 >> 6 & 7)) {
              return 0;
            }
            if (1 < uVar4 - 3) {
              if (uVar4 == 5) {
                return 0;
              }
              __assert_fail("pObj0->Type == KIT_DSD_AND || pObj0->Type == KIT_DSD_XOR",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                            ,0x116,"int Amap_CreateCheckEqual_rec(Kit_DsdNtk_t *, int, int)");
            }
            if (0x3ffffff < (uint)*pKVar8) {
              uVar7 = 0;
              do {
                uVar1 = *(ushort *)((long)&pKVar8[1].field_0x0 + uVar7 * 2);
                uVar2 = *(ushort *)((long)&pKVar6[1].field_0x0 + uVar7 * 2);
                if (((uVar2 ^ uVar1) & 1) != 0) {
                  return 0;
                }
                iVar3 = Amap_CreateCheckEqual_rec(p,uVar1 & 0xfffffffe,uVar2 & 0xfffffffe);
                if (iVar3 == 0) {
                  return 0;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < (uint)*pKVar8 >> 0x1a);
            }
          }
          return 1;
        }
      }
      __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                    ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x130,"int Abc_LitIsCompl(int)");
}

Assistant:

int Amap_CreateCheckEqual_rec( Kit_DsdNtk_t * p, int iLit0, int iLit1 )
{
    Kit_DsdObj_t * pObj0, * pObj1; 
    int i;
    assert( !Abc_LitIsCompl(iLit0) );
    assert( !Abc_LitIsCompl(iLit1) );
    pObj0 = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit0) );
    pObj1 = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit1) );
    if ( pObj0 == NULL && pObj1 == NULL )
        return 1;
    if ( pObj0 == NULL || pObj1 == NULL )
        return 0;
    if ( pObj0->Type != pObj1->Type )
        return 0;
    if ( pObj0->nFans != pObj1->nFans )
        return 0;
    if ( pObj0->Type == KIT_DSD_PRIME )
        return 0;
    assert( pObj0->Type == KIT_DSD_AND || pObj0->Type == KIT_DSD_XOR );
    for ( i = 0; i < (int)pObj0->nFans; i++ )
    {
        if ( Abc_LitIsCompl(pObj0->pFans[i]) != Abc_LitIsCompl(pObj1->pFans[i]) )
            return 0;
        if ( !Amap_CreateCheckEqual_rec( p, Abc_LitRegular(pObj0->pFans[i]), Abc_LitRegular(pObj1->pFans[i]) ) )
            return 0;
    }
    return 1;
}